

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ByteCodeEmitter.cpp
# Opt level: O0

void __thiscall
ByteCodeGenerator::FinalizeRegisters
          (ByteCodeGenerator *this,FuncInfo *funcInfo,FunctionBody *byteCodeFunction)

{
  bool bVar1;
  uint count;
  RegSlot RVar2;
  byte local_39;
  uint local_2c;
  RegSlot firstTmpReg;
  uint i;
  uint innerScopeCount;
  bool constReg;
  FunctionBody *byteCodeFunction_local;
  FuncInfo *funcInfo_local;
  ByteCodeGenerator *this_local;
  
  bVar1 = FuncInfo::NeedEnvRegister(funcInfo);
  if (bVar1) {
    bVar1 = FuncInfo::GetIsTopLevelEventHandler(funcInfo);
    local_39 = 0;
    if (!bVar1) {
      bVar1 = FuncInfo::IsGlobalFunction(funcInfo);
      local_39 = 0;
      if (bVar1) {
        local_39 = (this->flags & 0x400) != 0 ^ 0xff;
      }
    }
    FuncInfo::AssignEnvRegister(funcInfo,(bool)(local_39 & 1));
  }
  Js::FunctionBody::CheckAndSetConstantCount(byteCodeFunction,funcInfo->constRegsCount);
  SetClosureRegisters(this,funcInfo,byteCodeFunction);
  bVar1 = IsInDebugMode(this);
  if ((bVar1) || (bVar1 = Js::FunctionProxy::IsCoroutine((FunctionProxy *)byteCodeFunction), bVar1))
  {
    count = FuncInfo::InnerScopeCount(funcInfo);
    Js::FunctionBody::SetInnerScopeCount(byteCodeFunction,count);
    if (count != 0) {
      RVar2 = FuncInfo::NextVarRegister(funcInfo);
      FuncInfo::SetFirstInnerScopeReg(funcInfo,RVar2);
      for (local_2c = 1; local_2c < count; local_2c = local_2c + 1) {
        FuncInfo::NextVarRegister(funcInfo);
      }
    }
  }
  bVar1 = Js::FunctionProxy::IsCoroutine((FunctionProxy *)byteCodeFunction);
  if (bVar1) {
    bVar1 = ParseNodeFnc::IsAsync(funcInfo->root);
    if (bVar1) {
      FuncInfo::AssignAwaitRegister(funcInfo);
    }
    FuncInfo::AssignYieldRegister(funcInfo);
  }
  FuncInfo::SetFirstTmpReg(funcInfo,funcInfo->varRegsCount);
  RVar2 = FuncInfo::RegCount(funcInfo);
  Js::FunctionBody::SetFirstTmpReg(byteCodeFunction,RVar2);
  return;
}

Assistant:

void ByteCodeGenerator::FinalizeRegisters(FuncInfo* funcInfo, Js::FunctionBody* byteCodeFunction)
{
    if (funcInfo->NeedEnvRegister())
    {
        bool constReg = !funcInfo->GetIsTopLevelEventHandler() && funcInfo->IsGlobalFunction() && !(this->flags & fscrEval);
        funcInfo->AssignEnvRegister(constReg);
    }

    // Set the function body's constant count before emitting anything so that the byte code writer
    // can distinguish constants from variables.
    byteCodeFunction->CheckAndSetConstantCount(funcInfo->constRegsCount);

    this->SetClosureRegisters(funcInfo, byteCodeFunction);

    if (this->IsInDebugMode() || byteCodeFunction->IsCoroutine())
    {
        // Give permanent registers to the inner scopes in debug mode.
        // TODO: We create seperate debuggerscopes for each block which has own scope. These are stored in the var registers
        // allocated below. Ideally we should change this logic to not allocate separate registers for these and save the debug
        // info in corresponding symbols and use it from there. This will also affect the temp register allocation logic in
        // EmitOneFunction.
        uint innerScopeCount = funcInfo->InnerScopeCount();
        byteCodeFunction->SetInnerScopeCount(innerScopeCount);
        if (innerScopeCount)
        {
            funcInfo->SetFirstInnerScopeReg(funcInfo->NextVarRegister());
            for (uint i = 1; i < innerScopeCount; i++)
            {
                funcInfo->NextVarRegister();
            }
        }
    }

    // NOTE: The FunctionBody expects the yield reg to be the final non-temp.
    if (byteCodeFunction->IsCoroutine())
    {
        if (funcInfo->root->IsAsync())
        {
            funcInfo->AssignAwaitRegister();
        }
        funcInfo->AssignYieldRegister();
    }

    Js::RegSlot firstTmpReg = funcInfo->varRegsCount;
    funcInfo->SetFirstTmpReg(firstTmpReg);
    byteCodeFunction->SetFirstTmpReg(funcInfo->RegCount());
}